

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall QHash<int,int>::emplace<int_const&>(QHash<int,int> *this,int *key,int *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<int,_int> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<int_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d._0_4_ = *args;
        pVar2 = (piter)QHash<int,_int>::emplace_helper<int>
                                 ((QHash<int,_int> *)this,key,(int *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_004ffa5f;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QHash<int,_int>::detach((QHash<int,_int> *)this);
  pVar2 = (piter)emplace_helper<int_const&>(this,key,args);
  QHash<int,_int>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_004ffa5f:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }